

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::StmtScopeVisitor::handle_stmt(StmtScopeVisitor *this,Stmt *stmt)

{
  undefined8 this_00;
  bool bVar1;
  IRNodeKind IVar2;
  StatementType SVar3;
  mapped_type *__in;
  key_type this_01;
  ulong uVar4;
  InternalException *this_02;
  mapped_type *ppSVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_03;
  mapped_type *pmVar6;
  pair<std::__detail::_Node_iterator<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_false,_false>,_bool>
  pVar7;
  bool local_279;
  Scope<std::nullptr_t> *local_1e0;
  Scope<std::nullptr_t> *stmt_scope;
  _Node_iterator_base<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_1d0;
  VarStmt *local_1c8;
  VarStmt *var_stmt;
  type *value;
  type *rtl;
  type *local_1a8;
  type *value_pair;
  type *name;
  _Self local_190;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range2;
  string local_170;
  _Node_iterator_base<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_false>
  local_150;
  _Node_iterator_base<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_false>
  local_148;
  key_type local_140;
  Stmt *parent_stmt;
  undefined1 local_130;
  undefined1 local_128 [8];
  StmtFileNameVisitor v;
  Scope<std::nullptr_t> *scope;
  Scope<std::nullptr_t> *parent_scope;
  IRNode *parent;
  undefined1 local_88 [16];
  undefined4 local_78;
  allocator<char> local_61;
  string local_60;
  uint32_t local_3c;
  undefined1 local_38 [4];
  uint32_t ln;
  string filename;
  Stmt *stmt_local;
  StmtScopeVisitor *this_local;
  
  filename.field_2._8_8_ = stmt;
  std::__cxx11::string::string((string *)local_38);
  this_00 = filename.field_2._8_8_;
  local_3c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"debug-ignore",&local_61);
  bVar1 = IRNode::has_attribute((IRNode *)this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  if (bVar1) {
    local_78 = 1;
  }
  else {
    local_88._8_8_ =
         std::
         map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
         ::find(this->stmt_fn_ln_,(key_type *)((long)&filename.field_2 + 8));
    local_88._0_8_ =
         std::
         map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
         ::end(this->stmt_fn_ln_);
    bVar1 = std::operator!=((_Self *)(local_88 + 8),(_Self *)local_88);
    if (bVar1) {
      __in = std::
             map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
             ::at(this->stmt_fn_ln_,(key_type *)((long)&filename.field_2 + 8));
      std::tie<std::__cxx11::string,unsigned_int>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&parent,
                 (uint *)local_38);
      std::tuple<std::__cxx11::string&,unsigned_int&>::operator=
                ((tuple<std::__cxx11::string&,unsigned_int&> *)&parent,__in);
    }
    this_01 = (key_type)(**(code **)(*(long *)filename.field_2._8_8_ + 0x20))();
    IVar2 = IRNode::ir_node_kind((IRNode *)this_01);
    if (IVar2 == GeneratorKind) {
      v.stmt_fn_ln_ =
           (map<const_kratos::Stmt_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
            *)hgdb::json::Scope<hgdb::json::Module>::
              create_scope<hgdb::json::Scope<decltype(nullptr)>>
                        (&this->module_->super_Scope<hgdb::json::Module>);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        StmtFileNameVisitor::StmtFileNameVisitor((StmtFileNameVisitor *)local_128,this->stmt_fn_ln_)
        ;
        IRVisitor::visit_root((IRVisitor *)local_128,(IRNode *)filename.field_2._8_8_);
        std::__cxx11::string::operator=
                  ((string *)local_38,(string *)&v.super_IRVisitor.visited_._M_h._M_single_bucket);
        local_3c = v.filename.field_2._8_4_;
        StmtFileNameVisitor::~StmtFileNameVisitor((StmtFileNameVisitor *)local_128);
      }
      std::__cxx11::string::operator=((string *)(v.stmt_fn_ln_ + 0x30),(string *)local_38);
      scope = (Scope<std::nullptr_t> *)v.stmt_fn_ln_;
      pVar7 = std::
              unordered_map<kratos::Stmt_const*,hgdb::json::Scope<decltype(nullptr)>*,std::hash<kratos::Stmt_const*>,std::equal_to<kratos::Stmt_const*>,std::allocator<std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>>>
              ::emplace<kratos::Stmt*&,hgdb::json::Scope<decltype(nullptr)>*&>
                        ((unordered_map<kratos::Stmt_const*,hgdb::json::Scope<decltype(nullptr)>*,std::hash<kratos::Stmt_const*>,std::equal_to<kratos::Stmt_const*>,std::allocator<std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>>>
                          *)&this->stmt_scope_mapping_,(Stmt **)((long)&filename.field_2 + 8),
                         (Scope<std::nullptr_t> **)&v.stmt_fn_ln_);
      parent_stmt = (Stmt *)pVar7.first.
                            super__Node_iterator_base<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>,_false>
                            ._M_cur;
      local_130 = pVar7.second;
      SVar3 = Stmt::type((Stmt *)filename.field_2._8_8_);
      if (SVar3 != Assign) {
        local_78 = 1;
        goto LAB_0036840f;
      }
    }
    else {
      local_140 = this_01;
      local_148._M_cur =
           (__node_type *)
           std::
           unordered_map<const_kratos::Stmt_*,_hgdb::json::Scope<std::nullptr_t>_*,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>_>_>
           ::find(&this->stmt_scope_mapping_,&local_140);
      local_150._M_cur =
           (__node_type *)
           std::
           unordered_map<const_kratos::Stmt_*,_hgdb::json::Scope<std::nullptr_t>_*,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>_>_>
           ::end(&this->stmt_scope_mapping_);
      bVar1 = std::__detail::operator==(&local_148,&local_150);
      if (bVar1) {
        __range2._6_1_ = 1;
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"Scope not properly created",
                   (allocator<char> *)((long)&__range2 + 7));
        InternalException::InternalException(this_02,&local_170);
        __range2._6_1_ = 0;
        __cxa_throw(this_02,&InternalException::typeinfo,InternalException::~InternalException);
      }
      ppSVar5 = std::
                unordered_map<const_kratos::Stmt_*,_hgdb::json::Scope<std::nullptr_t>_*,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_hgdb::json::Scope<std::nullptr_t>_*>_>_>
                ::at(&this->stmt_scope_mapping_,&local_140);
      scope = *ppSVar5;
    }
    this_03 = Stmt::scope_context_abi_cxx11_((Stmt *)filename.field_2._8_8_);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::begin(this_03);
    local_190._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::end(this_03);
    while (bVar1 = std::operator!=(&__end2,&local_190), bVar1) {
      name = &std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end2)->first;
      value_pair = (type *)std::
                           get<0ul,std::__cxx11::string_const,std::pair<bool,std::__cxx11::string>>
                                     ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)name);
      rtl = &std::get<1ul,std::__cxx11::string_const,std::pair<bool,std::__cxx11::string>>
                       ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)name)->first;
      local_1a8 = (type *)rtl;
      value = (type *)std::get<0ul,bool,std::__cxx11::string>
                                ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)rtl);
      var_stmt = (VarStmt *)
                 std::get<1ul,bool,std::__cxx11::string>
                           ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)rtl);
      local_1c8 = add_variable<true>(this,scope,(string *)value_pair,(string *)var_stmt,
                                     (bool)((byte)value->_M_dataplus & 1));
      local_279 = false;
      if (local_1c8 != (VarStmt *)0x0) {
        local_1d0._M_cur =
             (__node_type *)
             std::
             unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(this->enable_conditions_,(key_type *)((long)&filename.field_2 + 8));
        stmt_scope = (Scope<std::nullptr_t> *)
                     std::
                     unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::end(this->enable_conditions_);
        local_279 = std::__detail::operator!=
                              (&local_1d0,
                               (_Node_iterator_base<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                *)&stmt_scope);
      }
      if (local_279 != false) {
        pmVar6 = std::
                 unordered_map<const_kratos::Stmt_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_kratos::Stmt_*>,_std::equal_to<const_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Stmt_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::at(this->enable_conditions_,(key_type *)((long)&filename.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)&(local_1c8->super_Scope<hgdb::json::VarStmt>).condition,
                   (string *)pmVar6);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    local_1e0 = add_stmt(this,scope,(Stmt *)filename.field_2._8_8_,(string *)local_38,local_3c);
    if (local_1e0 != (Scope<std::nullptr_t> *)0x0) {
      std::
      unordered_map<kratos::Stmt_const*,hgdb::json::Scope<decltype(nullptr)>*,std::hash<kratos::Stmt_const*>,std::equal_to<kratos::Stmt_const*>,std::allocator<std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>>>
      ::emplace<kratos::Stmt*&,hgdb::json::Scope<decltype(nullptr)>*&>
                ((unordered_map<kratos::Stmt_const*,hgdb::json::Scope<decltype(nullptr)>*,std::hash<kratos::Stmt_const*>,std::equal_to<kratos::Stmt_const*>,std::allocator<std::pair<kratos::Stmt_const*const,hgdb::json::Scope<decltype(nullptr)>*>>>
                  *)&this->stmt_scope_mapping_,(Stmt **)((long)&filename.field_2 + 8),&local_1e0);
    }
    local_78 = 0;
  }
LAB_0036840f:
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void handle_stmt(Stmt *stmt) {
        std::string filename;
        uint32_t ln = 0;

        if (stmt->has_attribute("debug-ignore")) return;

        if (stmt_fn_ln_.find(stmt) != stmt_fn_ln_.end()) {
            std::tie(filename, ln) = stmt_fn_ln_.at(stmt);
        }

        using namespace hgdb::json;
        auto *parent = stmt->parent();
        hgdb::json::Scope<> *parent_scope;
        if (parent->ir_node_kind() == IRNodeKind::GeneratorKind) {
            // this is top level
            auto *scope = module_.create_scope<Scope<>>();
            if (filename.empty()) {
                StmtFileNameVisitor v(stmt_fn_ln_);
                v.visit_root(stmt);
                filename = v.filename;
                ln = v.ln;
            }
            scope->filename = filename;
            parent_scope = scope;
            stmt_scope_mapping_.emplace(stmt, scope);

            if (stmt->type() != StatementType::Assign) {
                // only top level assign, i.e. continuous assignment can
                // have useful scope
                return;
            }

        } else {
            auto *parent_stmt = reinterpret_cast<Stmt *>(parent);
            if (stmt_scope_mapping_.find(parent_stmt) == stmt_scope_mapping_.end()) {
                throw InternalException("Scope not properly created");
            }
            parent_scope = stmt_scope_mapping_.at(parent_stmt);
        }

        // store all the context variables
        // TODO: use stack address as a way to determine the actual scope
        //  for now we flatten everything
        for (auto const &[name, value_pair] : stmt->scope_context()) {
            auto const &[rtl, value] = value_pair;
            // we don't put line number down for static variables
            // since we can't obtain them from Python
            auto *var_stmt = add_variable<true>(parent_scope, name, value, rtl);
            if (var_stmt && enable_conditions_.find(stmt) != enable_conditions_.end()) {
                var_stmt->condition = enable_conditions_.at(stmt);
            }
        }
        // add itself
        auto *stmt_scope = add_stmt(parent_scope, stmt, filename, ln);
        if (stmt_scope) {
            stmt_scope_mapping_.emplace(stmt, stmt_scope);
        }
    }